

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add127_test.cc
# Opt level: O0

void intgemm::anon_unknown_0::TestMultiplyShiftNonShift<intgemm::AVX2::Kernels8>
               (Index A_rows,Index width,Index B_cols,float int_tolerance,float float_tolerance,
               float MSE_float_tolerance,float MSE_int_tolerance)

{
  UnquantizeAndAddBiasAndWrite callback;
  UnquantizeAndAddBiasAndWrite callback_00;
  UnquantizeAndAddBiasAndWrite callback_01;
  anon_class_8_1_8989cfb7 callback_02;
  ostream *poVar1;
  float *pfVar2;
  float *pfVar3;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  result_type_conflict rVar4;
  float fVar5;
  float unquant_mult_forprep;
  AlignedVector<float> float_C;
  AlignedVector<float> slowint_C;
  AlignedVector<float> test_C;
  AlignedVector<signed_char> B_prep;
  AlignedVector<signed_char> A_prep_old;
  AlignedVector<unsigned_char> A_prep;
  float unquant_mult;
  float quant_mult;
  float alpha;
  float *it_2;
  float *__end2_2;
  float *__begin2_2;
  AlignedVector<float> *__range2_2;
  float *it_1;
  float *__end2_1;
  float *__begin2_1;
  AlignedVector<float> *__range2_1;
  float *it;
  float *__end2;
  float *__begin2;
  AlignedVector<float> *__range2;
  uniform_real_distribution<float> dist;
  mt19937 gen;
  AlignedVector<float> bias;
  AlignedVector<float> B;
  AlignedVector<float> A;
  ostringstream info;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffe828;
  Index cols;
  Index in_stack_ffffffffffffe830;
  undefined4 uVar6;
  float in_stack_ffffffffffffe834;
  undefined4 uVar7;
  uint8_t *in_stack_ffffffffffffe838;
  AlignedVector<float> *in_stack_ffffffffffffe840;
  undefined8 in_stack_ffffffffffffe858;
  Index B_cols_00;
  undefined8 in_stack_ffffffffffffe860;
  float *in_stack_ffffffffffffe868;
  float *in_stack_ffffffffffffe870;
  undefined4 in_stack_ffffffffffffe878;
  undefined4 in_stack_ffffffffffffe87c;
  undefined4 in_stack_ffffffffffffe880;
  undefined4 in_stack_ffffffffffffe884;
  string local_16b0 [32];
  UnquantizeAndAddBiasAndWrite local_1690;
  undefined4 uStack_1670;
  Index in_stack_ffffffffffffe994;
  Index in_stack_ffffffffffffe998;
  float in_stack_ffffffffffffe99c;
  undefined4 in_stack_ffffffffffffe9a0;
  undefined4 in_stack_ffffffffffffe9a4;
  float *in_stack_ffffffffffffe9a8;
  AlignedVector<float> local_1650;
  UnquantizeAndAddBiasAndWrite local_1640;
  AlignedVector<float> local_1628;
  AlignedVector<float> local_1618;
  AlignedVector<signed_char> local_1608;
  AlignedVector<signed_char> local_15f8;
  AlignedVector<unsigned_char> local_15e8;
  float local_15d4;
  undefined4 local_15d0;
  float local_15cc;
  float *local_15c8;
  float *local_15c0;
  float *local_15b8;
  AlignedVector<float> *local_15b0;
  float *local_15a8;
  float *local_15a0;
  float *local_1598;
  AlignedVector<float> *local_1590;
  float *local_1588;
  float *local_1580;
  float *local_1578;
  AlignedVector<float> *local_1570;
  float in_stack_fffffffffffff010;
  float in_stack_fffffffffffff014;
  float in_stack_fffffffffffff018;
  float in_stack_fffffffffffff01c;
  string *in_stack_fffffffffffff020;
  size_t in_stack_fffffffffffff028;
  float *in_stack_fffffffffffff030;
  float *in_stack_fffffffffffff038;
  float *in_stack_fffffffffffff040;
  Index in_stack_fffffffffffff384;
  Index in_stack_fffffffffffff388;
  Index in_stack_fffffffffffff38c;
  int8_t *in_stack_fffffffffffff390;
  int8_t *in_stack_fffffffffffff398;
  Index in_stack_fffffffffffff720;
  Index in_stack_fffffffffffff724;
  int8_t *in_stack_fffffffffffff728;
  Index in_stack_fffffffffffff734;
  Index in_stack_fffffffffffff738;
  Index in_stack_fffffffffffff73c;
  int8_t *in_stack_fffffffffffff740;
  uint8_t *in_stack_fffffffffffff748;
  AlignedVector<float> local_1d8;
  AlignedVector<float> local_1c8;
  AlignedVector<float> local_1b8 [2];
  ostringstream local_198 [396];
  uint local_c;
  uint local_8;
  uint local_4;
  
  local_c = in_EDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"8-bit AVX2");
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_4);
  poVar1 = std::operator<<(poVar1,'\t');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_8);
  poVar1 = std::operator<<(poVar1,'\t');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
  std::operator<<(poVar1,'\n');
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
             CONCAT44(in_stack_ffffffffffffe834,in_stack_ffffffffffffe830));
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
             CONCAT44(in_stack_ffffffffffffe834,in_stack_ffffffffffffe830));
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
             CONCAT44(in_stack_ffffffffffffe834,in_stack_ffffffffffffe830));
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)0x1e7d5f);
  std::uniform_real_distribution<float>::uniform_real_distribution
            ((uniform_real_distribution<float> *)
             CONCAT44(in_stack_ffffffffffffe834,in_stack_ffffffffffffe830),
             (float)((ulong)in_stack_ffffffffffffe828 >> 0x20),SUB84(in_stack_ffffffffffffe828,0));
  local_1570 = local_1b8;
  local_1578 = AlignedVector<float>::begin(local_1570);
  local_1580 = AlignedVector<float>::end(local_1570);
  for (; local_1578 != local_1580; local_1578 = local_1578 + 1) {
    local_1588 = local_1578;
    rVar4 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)
                       CONCAT44(in_stack_ffffffffffffe834,in_stack_ffffffffffffe830),
                       in_stack_ffffffffffffe828);
    *local_1588 = rVar4;
  }
  local_1590 = &local_1c8;
  local_1598 = AlignedVector<float>::begin(local_1590);
  local_15a0 = AlignedVector<float>::end(local_1590);
  for (; B_cols_00 = (Index)((ulong)in_stack_ffffffffffffe858 >> 0x20), local_1598 != local_15a0;
      local_1598 = local_1598 + 1) {
    local_15a8 = local_1598;
    rVar4 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)
                       CONCAT44(in_stack_ffffffffffffe834,in_stack_ffffffffffffe830),
                       in_stack_ffffffffffffe828);
    *local_15a8 = rVar4;
  }
  local_15b0 = &local_1d8;
  local_15b8 = AlignedVector<float>::begin(local_15b0);
  cols = (Index)((ulong)in_stack_ffffffffffffe828 >> 0x20);
  local_15c0 = AlignedVector<float>::end(local_15b0);
  for (; local_15b8 != local_15c0; local_15b8 = local_15b8 + 1) {
    local_15c8 = local_15b8;
    *local_15b8 = 0.0;
  }
  local_15cc = 2.0;
  local_15d0 = 0x427e0000;
  local_15d4 = 0.0002480005;
  AlignedVector<float>::size(local_1b8);
  AlignedVector<unsigned_char>::AlignedVector
            ((AlignedVector<unsigned_char> *)in_stack_ffffffffffffe840,
             (size_t)in_stack_ffffffffffffe838,
             CONCAT44(in_stack_ffffffffffffe834,in_stack_ffffffffffffe830));
  AlignedVector<float>::size(local_1b8);
  AlignedVector<signed_char>::AlignedVector
            ((AlignedVector<signed_char> *)in_stack_ffffffffffffe840,
             (size_t)in_stack_ffffffffffffe838,
             CONCAT44(in_stack_ffffffffffffe834,in_stack_ffffffffffffe830));
  AlignedVector<float>::size(&local_1c8);
  AlignedVector<signed_char>::AlignedVector
            ((AlignedVector<signed_char> *)in_stack_ffffffffffffe840,
             (size_t)in_stack_ffffffffffffe838,
             CONCAT44(in_stack_ffffffffffffe834,in_stack_ffffffffffffe830));
  AlignedVector<float>::begin(local_1b8);
  AlignedVector<unsigned_char>::begin(&local_15e8);
  AVX2::Kernels8::PrepareA
            ((float *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe838,in_stack_ffffffffffffe834,
             in_stack_ffffffffffffe830,cols);
  AlignedVector<float>::begin(local_1b8);
  AlignedVector<signed_char>::begin(&local_15f8);
  AVX2::Kernels8::PrepareA
            ((float *)in_stack_ffffffffffffe840,(int8_t *)in_stack_ffffffffffffe838,
             in_stack_ffffffffffffe834,in_stack_ffffffffffffe830,cols);
  AlignedVector<float>::begin(&local_1c8);
  AlignedVector<signed_char>::begin(&local_1608);
  AVX2::Kernels8::PrepareB
            (in_stack_ffffffffffffe9a8,
             (int8_t *)CONCAT44(in_stack_ffffffffffffe9a4,in_stack_ffffffffffffe9a0),
             in_stack_ffffffffffffe99c,in_stack_ffffffffffffe998,in_stack_ffffffffffffe994);
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
             CONCAT44(in_stack_ffffffffffffe834,in_stack_ffffffffffffe830));
  AlignedVector<float>::size(&local_1618);
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
             CONCAT44(in_stack_ffffffffffffe834,in_stack_ffffffffffffe830));
  AlignedVector<signed_char>::begin(&local_15f8);
  AlignedVector<signed_char>::begin(&local_1608);
  fVar5 = local_15d4;
  pfVar2 = AlignedVector<float>::begin(&local_1d8);
  pfVar3 = AlignedVector<float>::begin(&local_1628);
  callbacks::UnquantizeAndAddBiasAndWrite::UnquantizeAndAddBiasAndWrite
            (&local_1640,fVar5,pfVar2,pfVar3);
  uVar6 = SUB84(local_1640.bias_addr,0);
  uVar7 = (undefined4)((ulong)local_1640.bias_addr >> 0x20);
  callback.bias_addr = local_1640.output_addr;
  callback._0_8_ = local_1640.bias_addr;
  callback.output_addr = (float *)in_stack_ffffffffffffe840;
  AVX2::Kernels8::Multiply<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            (in_stack_fffffffffffff398,in_stack_fffffffffffff390,in_stack_fffffffffffff38c,
             in_stack_fffffffffffff388,in_stack_fffffffffffff384,callback);
  AlignedVector<float>::size(&local_1618);
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe840,(size_t)local_1640.output_addr,CONCAT44(uVar7,uVar6));
  AlignedVector<float>::begin(local_1b8);
  AlignedVector<float>::begin(&local_1c8);
  AlignedVector<float>::begin(&local_1650);
  callback_02.bias._4_4_ = in_stack_ffffffffffffe884;
  callback_02.bias._0_4_ = in_stack_ffffffffffffe880;
  references::
  Multiply<float,_float,_float,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kpu[P]intgemm_test_add127_test_cc:188:86),_nullptr>
            ((float *)CONCAT44(in_stack_ffffffffffffe87c,in_stack_ffffffffffffe878),
             in_stack_ffffffffffffe870,in_stack_ffffffffffffe868,
             (Index)((ulong)in_stack_ffffffffffffe860 >> 0x20),(Index)in_stack_ffffffffffffe860,
             B_cols_00,callback_02);
  fVar5 = (-local_15cc * local_15cc) / 127.0;
  AlignedVector<signed_char>::begin(&local_1608);
  pfVar2 = AlignedVector<float>::begin(&local_1d8);
  pfVar3 = AlignedVector<float>::begin(&local_1d8);
  callbacks::UnquantizeAndAddBiasAndWrite::UnquantizeAndAddBiasAndWrite
            ((UnquantizeAndAddBiasAndWrite *)&stack0xffffffffffffe988,fVar5,pfVar2,pfVar3);
  callback_00.bias_addr._4_4_ = in_stack_ffffffffffffe99c;
  callback_00.bias_addr._0_4_ = in_stack_ffffffffffffe998;
  callback_00._4_4_ = in_stack_ffffffffffffe994;
  callback_00.unquant_mult = (float)uStack_1670;
  callback_00.output_addr = (float *)in_stack_ffffffffffffe840;
  AVX2::Kernels8::PrepareBias<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            (in_stack_fffffffffffff728,in_stack_fffffffffffff724,in_stack_fffffffffffff720,
             callback_00);
  AlignedVector<unsigned_char>::begin(&local_15e8);
  AlignedVector<signed_char>::begin(&local_1608);
  fVar5 = local_15d4;
  pfVar2 = AlignedVector<float>::begin(&local_1d8);
  pfVar3 = AlignedVector<float>::begin(&local_1618);
  callbacks::UnquantizeAndAddBiasAndWrite::UnquantizeAndAddBiasAndWrite
            (&local_1690,fVar5,pfVar2,pfVar3);
  callback_01.bias_addr = local_1690.output_addr;
  callback_01._0_8_ = local_1690.bias_addr;
  callback_01.output_addr = (float *)in_stack_ffffffffffffe840;
  AVX2::Kernels8::Multiply8Shift<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            (in_stack_fffffffffffff748,in_stack_fffffffffffff740,in_stack_fffffffffffff73c,
             in_stack_fffffffffffff738,in_stack_fffffffffffff734,callback_01);
  AlignedVector<float>::begin(&local_1650);
  AlignedVector<float>::begin(&local_1628);
  AlignedVector<float>::begin(&local_1618);
  AlignedVector<float>::size(&local_1618);
  std::__cxx11::ostringstream::str();
  CompareMSE(in_stack_fffffffffffff040,in_stack_fffffffffffff038,in_stack_fffffffffffff030,
             in_stack_fffffffffffff028,in_stack_fffffffffffff020,in_stack_fffffffffffff01c,
             in_stack_fffffffffffff018,in_stack_fffffffffffff014,in_stack_fffffffffffff010);
  std::__cxx11::string::~string(local_16b0);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1e859f);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1e85ac);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1e85b9);
  AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x1e85c6);
  AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x1e85d3);
  AlignedVector<unsigned_char>::~AlignedVector((AlignedVector<unsigned_char> *)0x1e85e0);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1e85ed);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1e85fa);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1e8607);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void TestMultiplyShiftNonShift(Index A_rows, Index width, Index B_cols,
 float int_tolerance=.1, float float_tolerance=1, float MSE_float_tolerance=0, float MSE_int_tolerance=0) {
  std::ostringstream info;
  info << Routine::kName << "\t" << A_rows << '\t' << width << '\t' << B_cols << '\n';

  // Initialize A and B.
  AlignedVector<float> A(A_rows * width);
  AlignedVector<float> B(width * B_cols);
  AlignedVector<float> bias(B_cols);
  std::mt19937 gen;
  std::uniform_real_distribution<float> dist(-1.0f, 1.0f);
  for (auto& it : A) {
    it = dist(gen);
  }
  for (auto& it : B) {
    it = dist(gen);
  }
  for (auto& it : bias) {
    it = 0;
  }

  float alpha = 2.0f;
  float quant_mult = 127.0f / alpha;
  float unquant_mult = 1.0f / (quant_mult*quant_mult);

  AlignedVector<uint8_t> A_prep(A.size());
  AlignedVector<int8_t> A_prep_old(A.size());
  AlignedVector<int8_t> B_prep(B.size());
  Routine::PrepareA(A.begin(), A_prep.begin(), quant_mult, A_rows, width);
  Routine::PrepareA(A.begin(), A_prep_old.begin(), quant_mult, A_rows, width); //Non shited version
  Routine::PrepareB(B.begin(), B_prep.begin(), quant_mult, width, B_cols);

  AlignedVector<float> test_C(A_rows * B_cols);

  /*
   * Reference non shift multiplication instead of slowint
   */
  AlignedVector<float> slowint_C(test_C.size());
  Routine::Multiply(A_prep_old.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult, bias.begin(), slowint_C.begin()));

  AlignedVector<float> float_C(test_C.size());
  references::Multiply(A.begin(), B.begin(), float_C.begin(), A_rows, width, B_cols, [&](double sum, const callbacks::OutputBufferInfo& info) {
    return static_cast<float>(sum) + bias[info.col_idx];
  });

  /*
   * Multiply8 shift multiplication
   */
  float unquant_mult_forprep = (-1.0f)*(alpha)*(alpha)/(127.0f); //Minus one to invert add_ps later on
  Routine::PrepareBias(B_prep.begin(), width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult_forprep, bias.begin(), bias.begin()));
  Routine::Multiply8Shift(A_prep.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult, bias.begin(), test_C.begin()));

  CompareMSE(float_C.begin(), slowint_C.begin(), test_C.begin(), test_C.size(), info.str(),
   int_tolerance, float_tolerance, MSE_float_tolerance, MSE_int_tolerance);
}